

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

errr finish_parse_object_property(parser *p)

{
  ushort uVar1;
  long *plVar2;
  long *plVar3;
  uint16_t uVar4;
  long lVar5;
  long lVar6;
  
  z_info->property_max = 0;
  plVar3 = (long *)parser_priv(p);
  uVar4 = z_info->property_max;
  if (plVar3 != (long *)0x0) {
    do {
      uVar4 = uVar4 + 1;
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)0x0);
    z_info->property_max = uVar4;
  }
  obj_properties = (obj_property *)mem_zalloc((ulong)uVar4 * 0xd8 + 0xd8);
  uVar1 = z_info->property_max;
  plVar3 = (long *)parser_priv(p);
  if (plVar3 != (long *)0x0) {
    lVar5 = (ulong)uVar1 * 0xd8;
    lVar6 = (ulong)uVar1 + 1;
    do {
      if (lVar6 + -1 == 0 || lVar6 < 1) {
        __assert_fail("idx > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                      ,0xd75,"errr finish_parse_object_property(struct parser *)");
      }
      memcpy((void *)((long)obj_properties->type_mult + lVar5 + -0x20),plVar3,0xd8);
      plVar2 = (long *)*plVar3;
      mem_free(plVar3);
      lVar5 = lVar5 + -0xd8;
      lVar6 = lVar6 + -1;
      plVar3 = plVar2;
    } while (plVar2 != (long *)0x0);
  }
  z_info->property_max = z_info->property_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_object_property(struct parser *p) {
	struct obj_property *prop, *n;
	int idx;

	/* Scan the list for the max id */
	z_info->property_max = 0;
	prop = parser_priv(p);
	while (prop) {
		z_info->property_max++;
		prop = prop->next;
	}

	/* Allocate the direct access list and copy the data to it */
	obj_properties = mem_zalloc((z_info->property_max + 1) * sizeof(*prop));
	idx = z_info->property_max;
	for (prop = parser_priv(p); prop; prop = n, idx--) {
		assert(idx > 0);

		memcpy(&obj_properties[idx], prop, sizeof(*prop));
		n = prop->next;

		mem_free(prop);
	}
	z_info->property_max += 1;

	parser_destroy(p);
	return 0;
}